

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::ProcessPresetVariables(cmake *this)

{
  bool bVar1;
  reference var_00;
  ulong uVar2;
  CacheVariable *pCVar3;
  CacheEntryType local_34;
  CacheEntryType type;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>
  *var;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
  *__range1;
  cmake *this_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
           ::begin(&this->UnprocessedPresetVariables);
  var = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
           ::end(&this->UnprocessedPresetVariables);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&var), bVar1) {
    var_00 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>
             ::operator*(&__end1);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&var_00->second);
    if (bVar1) {
      local_34 = UNINITIALIZED;
      std::optional<cmCMakePresetsGraph::CacheVariable>::operator->(&var_00->second);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        pCVar3 = std::optional<cmCMakePresetsGraph::CacheVariable>::operator->(&var_00->second);
        local_34 = cmState::StringToCacheEntryType(&pCVar3->Type);
      }
      pCVar3 = std::optional<cmCMakePresetsGraph::CacheVariable>::operator->(&var_00->second);
      ProcessCacheArg(this,&var_00->first,&pCVar3->Value,local_34);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmake::ProcessPresetVariables()
{
  for (auto const& var : this->UnprocessedPresetVariables) {
    if (!var.second) {
      continue;
    }
    cmStateEnums::CacheEntryType type = cmStateEnums::UNINITIALIZED;
    if (!var.second->Type.empty()) {
      type = cmState::StringToCacheEntryType(var.second->Type);
    }
    this->ProcessCacheArg(var.first, var.second->Value, type);
  }
}